

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_solve.cpp
# Opt level: O1

void __thiscall
Clasp::mt::LocalDistribution::LocalDistribution
          (LocalDistribution *this,Policy *p,uint32 maxT,uint32 topo)

{
  ThreadData **ppTVar1;
  ThreadData *pTVar2;
  uint64 uVar3;
  ulong uVar4;
  
  Distributor::Distributor(&this->super_Distributor,p);
  (this->super_Distributor)._vptr_Distributor = (_func_int **)&PTR__LocalDistribution_001eb3a0;
  this->thread_ = (ThreadData **)0x0;
  LOCK();
  (this->blocks_).top._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  this->numThread_ = maxT;
  ppTVar1 = (ThreadData **)operator_new__((ulong)maxT * 8);
  this->thread_ = ppTVar1;
  if (maxT != 0) {
    uVar4 = 0;
    do {
      pTVar2 = (ThreadData *)alignedAllocChecked(0x80,(size_t)p);
      LOCK();
      (pTVar2->sentinel).super_RawNode.next._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      (pTVar2->sentinel).data = (void *)0x0;
      LOCK();
      (pTVar2->received).head_._M_b._M_p = &pTVar2->sentinel;
      UNLOCK();
      (pTVar2->received).tail_ = &pTVar2->sentinel;
      p = (Policy *)(ulong)topo;
      uVar3 = ParallelSolveOptions::initPeerMask((uint32)uVar4,topo,maxT);
      pTVar2->peers = uVar3;
      pTVar2->free = (QNode *)0x0;
      this->thread_[uVar4] = pTVar2;
      uVar4 = uVar4 + 1;
    } while (maxT != uVar4);
  }
  return;
}

Assistant:

LocalDistribution::LocalDistribution(const Policy& p, uint32 maxT, uint32 topo) : Distributor(p), thread_(0), numThread_(0) {
	typedef ParallelSolveOptions::Integration::Topology Topology;
	assert(maxT <= ParallelSolveOptions::supportedSolvers());
	Topology t = static_cast<Topology>(topo);
	thread_    = new ThreadData*[numThread_ = maxT];
	size_t sz  = ((sizeof(ThreadData) + 63) / 64) * 64;
	for (uint32 i = 0; i != maxT; ++i) {
		ThreadData* ti = new (alignedAllocChecked(sz)) ThreadData;
		ti->received.init(&ti->sentinel);
		ti->peers = ParallelSolveOptions::initPeerMask(i, t, maxT);
		ti->free  = 0;
		thread_[i]= ti;
	}
}